

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O2

Result __thiscall
ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
          (Ruckig<3UL,_ruckig::StandardVector,_false> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input,
          OutputParameter<3UL,_ruckig::StandardVector> *output)

{
  double *pdVar1;
  ulong uVar2;
  bool bVar3;
  Result RVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar5 = std::chrono::_V2::steady_clock::now();
  output->new_calculation = false;
  if ((this->current_input_initialized != true) ||
     (bVar3 = InputParameter<3UL,_ruckig::StandardVector>::operator!=(input,&this->current_input),
     bVar3)) {
    RVar4 = calculate(this,input,&output->trajectory,&output->was_calculation_interrupted);
    if ((RVar4 != Working) && (RVar4 != ErrorPositionalLimits)) {
      return RVar4;
    }
    InputParameter<3UL,_ruckig::StandardVector>::operator=(&this->current_input,input);
    this->current_input_initialized = true;
    output->new_calculation = true;
    dVar7 = 0.0;
  }
  else {
    dVar7 = output->time;
    RVar4 = Working;
  }
  uVar2 = output->new_section;
  dVar7 = dVar7 + this->delta_time;
  output->time = dVar7;
  Trajectory<3UL,_ruckig::StandardVector>::at_time
            (&output->trajectory,dVar7,&output->new_position,&output->new_velocity,
             &output->new_acceleration,&output->new_jerk,&output->new_section);
  output->did_section_change = uVar2 < output->new_section;
  lVar6 = std::chrono::_V2::steady_clock::now();
  output->calculation_duration = (double)(lVar6 - lVar5) / 1000.0;
  OutputParameter<3UL,_ruckig::StandardVector>::pass_to_input(output,&this->current_input);
  pdVar1 = &(output->trajectory).duration;
  if (*pdVar1 <= output->time && output->time != *pdVar1) {
    RVar4 = Finished;
  }
  return RVar4;
}

Assistant:

Result update(const InputParameter<DOFs, CustomVector>& input, OutputParameter<DOFs, CustomVector>& output) {
        const auto start = std::chrono::steady_clock::now();

        if constexpr (DOFs == 0 && throw_error) {
            if (degrees_of_freedom != input.degrees_of_freedom || degrees_of_freedom != output.degrees_of_freedom) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        output.new_calculation = false;

        Result result {Result::Working};
        if (!current_input_initialized || input != current_input) {
            result = calculate(input, output.trajectory, output.was_calculation_interrupted);
            if (result != Result::Working && result != Result::ErrorPositionalLimits) {
                return result;
            }

            current_input = input;
            current_input_initialized = true;
            output.time = 0.0;
            output.new_calculation = true;
        }

        const size_t old_section = output.new_section;
        output.time += delta_time;
        output.trajectory.at_time(output.time, output.new_position, output.new_velocity, output.new_acceleration, output.new_jerk, output.new_section);
        output.did_section_change = (output.new_section > old_section);  // Report only forward section changes

        const auto stop = std::chrono::steady_clock::now();
        output.calculation_duration = std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count() / 1000.0;

        output.pass_to_input(current_input);

        if (output.time > output.trajectory.get_duration()) {
            return Result::Finished;
        }

        return result;
    }